

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O1

fdb_status btreeblk_operation_end(void *voidhandle)

{
  byte bVar1;
  list_elem *plVar2;
  int iVar3;
  fdb_status fVar4;
  list_elem *plVar5;
  list_elem *plVar6;
  
  if (*(list_elem **)((long)voidhandle + 0x18) != (list_elem *)0x0) {
    plVar6 = *(list_elem **)((long)voidhandle + 0x18);
    do {
      iVar3 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),(bid_t)plVar6[-2].prev);
      if (iVar3 == 0) {
        fdb_log_impl((err_log_callback *)0x0,1,FDB_RESULT_WRITE_FAIL,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/btreeblock.cc"
                     ,"btreeblk_operation_end",0x38a,"b+tree node write fail, BID %zu, file %s",
                     ((btreeblk_block *)(plVar6 + -2))->bid,
                     **(undefined8 **)((long)voidhandle + 0x38));
        return FDB_RESULT_WRITE_FAIL;
      }
      fVar4 = _btreeblk_write_dirty_block
                        ((btreeblk_handle *)voidhandle,(btreeblk_block *)(plVar6 + -2));
      if (fVar4 != FDB_RESULT_SUCCESS) {
        return fVar4;
      }
      if (*(uint *)(*(long *)((long)voidhandle + 0x38) + 0x10) <
          (uint)(*voidhandle + *(int *)((long)&plVar6[-2].next + 4))) {
        plVar5 = list_remove((list *)((long)voidhandle + 0x18),plVar6);
        *(undefined1 *)&plVar6[-1].prev = 0;
        list_push_front((list *)((long)voidhandle + 0x28),plVar6);
      }
      else {
        plVar5 = plVar6->next;
      }
      plVar6 = plVar5;
    } while (plVar5 != (list_elem *)0x0);
  }
  if (*(list_elem **)((long)voidhandle + 0x28) != (list_elem *)0x0) {
    plVar6 = *(list_elem **)((long)voidhandle + 0x28);
    do {
      if (*(char *)&plVar6[-1].prev != '\0') {
        fVar4 = _btreeblk_write_dirty_block
                          ((btreeblk_handle *)voidhandle,(btreeblk_block *)(plVar6 + -2));
        if (fVar4 != FDB_RESULT_SUCCESS) {
          return fVar4;
        }
        *(undefined1 *)&plVar6[-1].prev = 0;
      }
      bVar1 = *(byte *)((long)&plVar6[-1].prev + 1);
      if (bVar1 < 8) {
        *(byte *)((long)&plVar6[-1].prev + 1) = bVar1 + 1;
        plVar5 = plVar6->next;
      }
      else {
        plVar5 = list_remove((list *)((long)voidhandle + 0x28),plVar6);
        plVar2 = plVar6[2].next;
        if (plVar2 != (list_elem *)0x0) {
          plVar2->prev = plVar6[-1].next;
          list_push_front((list *)((long)voidhandle + 0x48),(list_elem *)&plVar2->next);
          plVar6[2].next = (list_elem *)0x0;
        }
        free((btreeblk_block *)(plVar6 + -2));
      }
      plVar6 = plVar5;
    } while (plVar5 != (list_elem *)0x0);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status btreeblk_operation_end(void *voidhandle)
{
    // flush and write all items in allocation list
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    struct list_elem *e;
    struct btreeblk_block *block;
    int writable;
    fdb_status status = FDB_RESULT_SUCCESS;

    // write and free items in allocation list
    e = list_begin(&handle->alc_list);
    while(e){
        block = _get_entry(e, struct btreeblk_block, le);
        writable = filemgr_is_writable(handle->file, block->bid);
        if (writable) {
            status = _btreeblk_write_dirty_block(handle, block);
            if (status != FDB_RESULT_SUCCESS) {
                return status;
            }
        } else {
            fdb_log(nullptr, FDB_LOG_FATAL,
                    FDB_RESULT_WRITE_FAIL,
                    "b+tree node write fail, BID %zu, file %s",
                    block->bid,
                    handle->file->filename);
            return FDB_RESULT_WRITE_FAIL;
        }

        if (block->pos + (handle->nodesize) > (handle->file->blocksize) || !writable) {
            // remove from alc_list and insert into read list
            e = list_remove(&handle->alc_list, &block->le);
            block->dirty = 0;
            list_push_front(&handle->read_list, &block->le);
        }else {
            // reserve the block when there is enough space and the block is writable
            e = list_next(e);
        }
    }

    // free items in read list
    // list
    e = list_begin(&handle->read_list);
    while(e){
        block = _get_entry(e, struct btreeblk_block, le);

        if (block->dirty) {
            // write back only when the block is modified
            status = _btreeblk_write_dirty_block(handle, block);
            if (status != FDB_RESULT_SUCCESS) {
                return status;
            }
            block->dirty = 0;
        }

        if (block->age >= BTREEBLK_AGE_LIMIT) {
            e = list_remove(&handle->read_list, &block->le);
            _btreeblk_free_dirty_block(handle, block);
        } else {
            block->age++;
            e = list_next(e);
        }
    }

    return status;
}